

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_t.h
# Opt level: O2

void __thiscall tensor_t<gradient_t>::tensor_t(tensor_t<gradient_t> *this,int _x,int _y,int _z)

{
  allocator_type local_41;
  _Vector_base<gradient_t,_std::allocator<gradient_t>_> local_40;
  
  (this->data).super__Vector_base<gradient_t,_std::allocator<gradient_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data).super__Vector_base<gradient_t,_std::allocator<gradient_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data).super__Vector_base<gradient_t,_std::allocator<gradient_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->size).x = 0;
  (this->size).y = 0;
  (this->size).z = 0;
  std::vector<gradient_t,_std::allocator<gradient_t>_>::vector
            ((vector<gradient_t,_std::allocator<gradient_t>_> *)&local_40,(long)(_y * _x * _z),
             &local_41);
  std::vector<gradient_t,_std::allocator<gradient_t>_>::_M_move_assign(&this->data,&local_40);
  std::_Vector_base<gradient_t,_std::allocator<gradient_t>_>::~_Vector_base(&local_40);
  (this->size).x = _x;
  (this->size).y = _y;
  (this->size).z = _z;
  return;
}

Assistant:

tensor_t(int _x, int _y, int _z) {
    data = std::vector<T>(static_cast<unsigned long>(_x * _y * _z));
    size.x = _x;
    size.y = _y;
    size.z = _z;
  }